

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

t_debug_script * __thiscall
anon_unknown.dwarf_328d25::t_debugger::f_find_module(t_debugger *this,wstring_view a_path)

{
  __pthread_internal_list *p_Var1;
  int iVar2;
  t_debug_script *ptVar3;
  t_debugger *ptVar4;
  size_t __n;
  size_type __rlen;
  
  __n = a_path._M_len;
  ptVar4 = (t_debugger *)this[5].v_out;
  do {
    if (ptVar4 == this + 5) {
      return (t_debug_script *)0x0;
    }
    p_Var1 = (ptVar4->v_mutex).super___mutex_base._M_mutex.__data.__list.__next;
    if (((p_Var1[5].__prev != (__pthread_internal_list *)0x0) &&
        (ptVar3 = (t_debug_script *)
                  __dynamic_cast(&p_Var1[5].__prev[4].__next,&xemmai::t_module::t_body::typeinfo,
                                 &xemmai::t_debug_script::typeinfo,0),
        ptVar3 != (t_debug_script *)0x0)) &&
       ((ptVar3->super_t_script).v_path._M_string_length == __n)) {
      if (__n == 0) {
        return ptVar3;
      }
      iVar2 = wmemcmp(a_path._M_str,(ptVar3->super_t_script).v_path._M_dataplus._M_p,__n);
      if (iVar2 == 0) {
        return ptVar3;
      }
    }
    ptVar4 = (t_debugger *)std::_Rb_tree_increment((_Rb_tree_node_base *)ptVar4);
  } while( true );
}

Assistant:

t_debug_script* f_find_module(std::wstring_view a_path)
	{
		for (auto& pair : v_engine.f_modules()) {
			auto& body = pair.second->f_as<t_module>().v_body;
			if (!body) continue;
			auto debug = dynamic_cast<t_debug_script*>(&body->f_as<t_module::t_body>());
			if (debug && debug->v_path == a_path) return debug;
		}
		return nullptr;
	}